

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O1

void nvlist_move_string(nvlist_t *nvl,char *name,char *value)

{
  int *piVar1;
  nvpair_t *nvp;
  int iVar2;
  
  if (nvl == (nvlist_t *)0x0) {
    free(value);
  }
  else {
    if (nvl->nvl_magic != 0x6e766c) {
LAB_0010a2f2:
      __assert_fail("(nvl)->nvl_magic == 0x6e766c",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                    ,0xb2,"int nvlist_error(const nvlist_t *)");
    }
    if (nvl->nvl_error == 0) {
      nvp = nvpair_move_string(name,value);
      if (nvp == (nvpair_t *)0x0) {
        piVar1 = __errno_location();
        iVar2 = 0xc;
        if (*piVar1 != 0) {
          iVar2 = *piVar1;
        }
        nvl->nvl_error = iVar2;
        *piVar1 = iVar2;
        return;
      }
      nvlist_move_nvpair(nvl,nvp);
      return;
    }
    free(value);
    if (nvl != (nvlist_t *)0x0) {
      if (nvl->nvl_magic != 0x6e766c) goto LAB_0010a2f2;
      iVar2 = nvl->nvl_error;
      goto LAB_0010a2b5;
    }
  }
  iVar2 = 0xc;
LAB_0010a2b5:
  piVar1 = __errno_location();
  *piVar1 = iVar2;
  return;
}

Assistant:

void
nvlist_move_string(nvlist_t *nvl, const char *name, char *value)
{
	nvpair_t *nvp;

	if (nvlist_error(nvl) != 0) {
		nv_free(value);
		ERRNO_SET(nvlist_error(nvl));
		return;
	}

	nvp = nvpair_move_string(name, value);
	if (nvp == NULL) {
		nvl->nvl_error = ERRNO_OR_DEFAULT(ENOMEM);
		ERRNO_SET(nvl->nvl_error);
	} else {
		(void)nvlist_move_nvpair(nvl, nvp);
	}
}